

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe18At7(uint8_t *buf)

{
  return (ulong)((uint)(buf[3] >> 7) + ((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 1) << 0x10) * 2);
}

Assistant:

std::uint64_t readFlUIntBe18At7(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 1;
    res |= (buf[3] >> 7);
    res &= UINT64_C(0x3ffff);
    return res;
}